

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_precompile_own_augment
                 (lysc_ctx *ctx,lysp_node_augment *aug_p,lysp_module *pmod,lysp_ext_instance *ext)

{
  lys_module *plVar1;
  undefined8 *object;
  lys_module *mod;
  lysc_augment *aug;
  lysc_nodeid *nodeid;
  lysp_ext_instance *plStack_28;
  LY_ERR ret;
  lysp_ext_instance *ext_local;
  lysp_module *pmod_local;
  lysp_node_augment *aug_p_local;
  lysc_ctx *ctx_local;
  
  nodeid._4_4_ = 0;
  aug = (lysc_augment *)0x0;
  plStack_28 = ext;
  ext_local = (lysp_ext_instance *)pmod;
  pmod_local = (lysp_module *)aug_p;
  aug_p_local = (lysp_node_augment *)ctx;
  nodeid._4_4_ = lys_precompile_nodeid(ctx->ctx,(aug_p->field_0).node.name,(lysc_nodeid **)&aug);
  if (nodeid._4_4_ == LY_SUCCESS) {
    plVar1 = lys_schema_node_get_module
                       ((ly_ctx *)(aug_p_local->field_0).node.parent,(char *)aug->aug_pmod->mod,
                        (lysp_module *)ext_local);
    if (plVar1 == (lys_module *)0x0) {
      ly_log((ly_ctx *)(aug_p_local->field_0).node.parent,LY_LLERR,LY_EINT,"Internal error (%s:%d)."
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
             ,0x880);
      nodeid._4_4_ = LY_EINT;
    }
    else if (plVar1 == *(lys_module **)((long)&aug_p_local->field_0 + 8)) {
      object = (undefined8 *)calloc(1,0x28);
      if (object == (undefined8 *)0x0) {
        ly_log((ly_ctx *)(aug_p_local->field_0).node.parent,LY_LLERR,LY_EMEM,
               "Memory allocation failed (%s()).","lys_precompile_own_augment");
        nodeid._4_4_ = LY_EMEM;
      }
      else {
        nodeid._4_4_ = ly_set_add((ly_set *)&aug_p_local->child,object,'\x01',(uint32_t *)0x0);
        if (nodeid._4_4_ == LY_SUCCESS) {
          *object = aug;
          aug = (lysc_augment *)0x0;
          object[1] = ext_local;
          object[3] = plStack_28;
          object[4] = pmod_local;
        }
      }
    }
  }
  lysc_nodeid_free((ly_ctx *)(aug_p_local->field_0).node.parent,(lysc_nodeid *)aug);
  return nodeid._4_4_;
}

Assistant:

static LY_ERR
lys_precompile_own_augment(struct lysc_ctx *ctx, struct lysp_node_augment *aug_p, const struct lysp_module *pmod,
        const struct lysp_ext_instance *ext)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_nodeid *nodeid = NULL;
    struct lysc_augment *aug;
    const struct lys_module *mod;

    /* compile its target, it was already parsed and fully checked (except for the existence of the nodes) */
    ret = lys_precompile_nodeid(ctx->ctx, aug_p->nodeid, &nodeid);
    LY_CHECK_GOTO(ret, cleanup);

    mod = lys_schema_node_get_module(ctx->ctx, nodeid->prefix[0], pmod);
    LY_CHECK_ERR_GOTO(!mod, LOGINT(ctx->ctx); ret = LY_EINT, cleanup);
    if (mod != ctx->cur_mod) {
        /* augment for another module, ignore */
        goto cleanup;
    }

    /* allocate new compiled augment and store it in the set */
    aug = calloc(1, sizeof *aug);
    LY_CHECK_ERR_GOTO(!aug, LOGMEM(ctx->ctx); ret = LY_EMEM, cleanup);
    LY_CHECK_GOTO(ret = ly_set_add(&ctx->augs, aug, 1, NULL), cleanup);

    aug->nodeid = nodeid;
    nodeid = NULL;
    aug->aug_pmod = pmod;
    aug->ext = ext;
    aug->aug_p = aug_p;

cleanup:
    lysc_nodeid_free(ctx->ctx, nodeid);
    return ret;
}